

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O2

void prvTidyPopInline(TidyDocImpl *doc,Node *node)

{
  Lexer *pLVar1;
  Bool BVar2;
  ulong uVar3;
  Lexer *lexer;
  
  pLVar1 = doc->lexer;
  if (node != (Node *)0x0) {
    BVar2 = IsNodePushable(node);
    if (BVar2 == no) {
      return;
    }
    if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_A)) {
      uVar3 = (ulong)pLVar1->istacksize;
      do {
        if ((int)uVar3 == 0) {
          return;
        }
        PopIStack(doc);
        uVar3 = (ulong)pLVar1->istacksize;
      } while ((pLVar1->istack[uVar3].tag)->id != TidyTag_A);
      return;
    }
  }
  if ((pLVar1->istacksize != 0) &&
     (PopIStack(doc), pLVar1->istack + pLVar1->istacksize <= pLVar1->insert)) {
    pLVar1->insert = (IStack *)0x0;
  }
  return;
}

Assistant:

void TY_(PopInline)( TidyDocImpl* doc, Node *node )
{
    Lexer* lexer = doc->lexer;

    if (node)
    {
        if ( !IsNodePushable(node) )
            return;

        /* if node is </a> then pop until we find an <a> */
        if ( nodeIsA(node) )
        {
            PopIStackUntil( doc, TidyTag_A );
            return;
        }
    }

    if (lexer->istacksize > 0)
    {
        PopIStack( doc );

        /* #427822 - fix by Randy Waki 7 Aug 00 */
        if (lexer->insert >= lexer->istack + lexer->istacksize)
            lexer->insert = NULL;
    }
}